

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

int main(void)

{
  __single_object _Var1;
  thread thread;
  __single_object coro;
  long *local_10;
  
  std::make_unique<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>();
  SCoro::Poll<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>
            ((SCoro<PauseResume::Start,_PauseResume::Event> *)
             coro._M_t.
             super___uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
             .super__Head_base<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_false>.
             _M_head_impl);
  thread._M_id._M_thread = (id)0;
  local_10 = (long *)operator_new(0x10);
  _Var1 = coro;
  coro._M_t.
  super___uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
  .super__Head_base<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_false>._M_head_impl
       = (__uniq_ptr_data<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>,_true,_true>
          )(__uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
            )0x0;
  *local_10 = (long)&PTR___State_impl_00103d80;
  ((__uniq_ptr_data<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>,_true,_true>
    *)(local_10 + 1))->
  super___uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
       = (__uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
          )_Var1._M_t.
           super___uniq_ptr_impl<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
           .super__Head_base<0UL,_SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_*,_false>.
           _M_head_impl;
  std::thread::_M_start_thread(&thread,&local_10,0);
  if (local_10 != (long *)0x0) {
    (**(code **)(*local_10 + 8))();
  }
  std::thread::join();
  std::thread::~thread(&thread);
  std::
  unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
  ::~unique_ptr(&coro);
  return 0;
}

Assistant:

int main()
{
    auto coro = std::make_unique<PauseResume::scoro>();
    coro->Poll();
    // simulate async event
    // This could be finished by an interrupt or scheduler, timer, IOCP etc...
    std::thread thread
    {
        [](decltype(coro) continue_after_event)
        {
            std::string input;
            std::getline(std::cin, input);
            if (input.compare("x") == 0)
            {
                continue_after_event->Poll();
            }
        },
        std::move(coro)
    };

    thread.join();
}